

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O1

void __thiscall
ICM::Compiler::IdentifierAnalysis::setIdentifier(IdentifierAnalysis *this,Element *element)

{
  IndexTable<unsigned_long,_ICM::IdentTableUnit> *this_00;
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  IdentIndex ii;
  IdentIndex local_48;
  IdentTableUnit local_40;
  
  local_48.space_index = *GlobalIdentManager;
  local_48.ident_index = 0;
  bVar1 = isIdentDefined(this,&element->index,&local_48);
  uVar5 = (ulong)local_48.space_index;
  uVar4 = (DAT_00153800 - DAT_001537f8 >> 3) * -0x5555555555555555;
  if (bVar1) {
    if (uVar4 < uVar5 || uVar4 - uVar5 == 0) {
LAB_00140142:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    uVar2 = (*(uint *)(**(long **)(DAT_001537f8 + 0x10 + uVar5 * 0x18) +
                      (ulong)local_48.ident_index * 0x20) & 0xff) << 8 | 3;
  }
  else {
    if (uVar4 < uVar5 || uVar4 - uVar5 == 0) goto LAB_00140142;
    this_00 = *(IndexTable<unsigned_long,_ICM::IdentTableUnit> **)
               (DAT_001537f8 + 0x10 + uVar5 * 0x18);
    local_40.type = I_DyVarb;
    local_40.index = 0;
    local_40.field_3.StVarb = (Object *)(Static + 0x10);
    local_40.field_2.dimtype = 3;
    sVar3 = Common::IndexTable<unsigned_long,_ICM::IdentTableUnit>::insert
                      (this_00,&element->index,&local_40);
    (this_00->data).super__Vector_base<ICM::IdentTableUnit,_std::allocator<ICM::IdentTableUnit>_>.
    _M_impl.super__Vector_impl_data._M_start[sVar3].index = sVar3;
    local_48.ident_index = (IdentBasicIndex)sVar3;
    uVar2 = 0x403;
  }
  (element->field_0).type = uVar2;
  element->index = CONCAT44(local_48.ident_index,local_48.space_index);
  return;
}

Assistant:

void setIdentifier(Element &element) {
				const IdentKey &key = element.getIndex();
				IdentIndex ii(getCurrentIdentSpaceIndex());
				if (isIdentDefined(key, ii)) {
					IdentTableUnit &itu = getFromIdentTable(ii);
					setIdent(element, itu.type, ii);
				}
				else {
					ii.ident_index = insertFromIdentTable(ii.space_index, key, I_DyVarb);
					setIdent(element, I_DyVarb, ii);
				}
			}